

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O3

void __thiscall
spirv_cross::CompilerGLSL::emit_binary_op_cast
          (CompilerGLSL *this,uint32_t result_type,uint32_t result_id,uint32_t op0,uint32_t op1,
          char *op,BaseType input_type,bool skip_cast_if_equal_type,bool implicit_integer_promotion)

{
  bool bVar1;
  SPIRType *pSVar2;
  string *ts_3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffda8;
  undefined1 local_24a [2];
  string expr;
  undefined1 *local_228 [2];
  undefined1 local_218 [16];
  char *op_local;
  string cast_op1;
  string cast_op0;
  string local_1c0;
  string bitop;
  SPIRType expected_type;
  
  cast_op0._M_dataplus._M_p = (pointer)&cast_op0.field_2;
  cast_op0._M_string_length = 0;
  cast_op0.field_2._M_local_buf[0] = '\0';
  cast_op1._M_dataplus._M_p = (pointer)&cast_op1.field_2;
  cast_op1._M_string_length = 0;
  cast_op1.field_2._M_local_buf[0] = '\0';
  op_local = op;
  binary_op_bitcast_helper
            (&expected_type,this,&cast_op0,&cast_op1,&input_type,op0,op1,skip_cast_if_equal_type);
  pSVar2 = Variant::get<spirv_cross::SPIRType>
                     ((this->super_Compiler).ir.ids.super_VectorView<spirv_cross::Variant>.ptr +
                      result_type);
  ts_3 = &cast_op1;
  join<std::__cxx11::string&,char_const(&)[2],char_const*&,char_const(&)[2],std::__cxx11::string&>
            (&bitop,(spirv_cross *)&cast_op0,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x2f14f1,
             (char (*) [2])&op_local,(char **)0x2f14f1,(char (*) [2])ts_3,in_stack_fffffffffffffda8)
  ;
  expr._M_dataplus._M_p = (pointer)&expr.field_2;
  expr._M_string_length = 0;
  expr.field_2._M_local_buf[0] = '\0';
  if (implicit_integer_promotion == false) {
    if (pSVar2->basetype == Boolean || pSVar2->basetype == input_type) {
      ::std::__cxx11::string::operator=((string *)&expr,(string *)&bitop);
      goto LAB_0026c66a;
    }
    expected_type.basetype = input_type;
    (*(this->super_Compiler)._vptr_Compiler[0x3b])(local_228,this,pSVar2);
    local_24a[1] = 0x28;
    local_24a[0] = 0x29;
    join<std::__cxx11::string,char,std::__cxx11::string&,char>
              (&local_1c0,(spirv_cross *)local_228,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(local_24a + 1),
               (char *)&bitop,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_24a,
               (char *)ts_3);
    ::std::__cxx11::string::operator=((string *)&expr,(string *)&local_1c0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1c0._M_dataplus._M_p != &local_1c0.field_2) {
      operator_delete(local_1c0._M_dataplus._M_p);
    }
    if (local_228[0] == local_218) goto LAB_0026c66a;
  }
  else {
    (*(this->super_Compiler)._vptr_Compiler[0x13])(local_228,this,pSVar2,0);
    local_24a[1] = 0x28;
    local_24a[0] = 0x29;
    join<std::__cxx11::string,char,std::__cxx11::string&,char>
              (&local_1c0,(spirv_cross *)local_228,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(local_24a + 1),
               (char *)&bitop,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_24a,
               (char *)ts_3);
    ::std::__cxx11::string::operator=((string *)&expr,(string *)&local_1c0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1c0._M_dataplus._M_p != &local_1c0.field_2) {
      operator_delete(local_1c0._M_dataplus._M_p);
    }
    if (local_228[0] == local_218) goto LAB_0026c66a;
  }
  operator_delete(local_228[0]);
LAB_0026c66a:
  bVar1 = should_forward(this,op0);
  if (bVar1) {
    bVar1 = should_forward(this,op1);
  }
  else {
    bVar1 = false;
  }
  emit_op(this,result_type,result_id,&expr,bVar1,false);
  Compiler::inherit_expression_dependencies(&this->super_Compiler,result_id,op0);
  Compiler::inherit_expression_dependencies(&this->super_Compiler,result_id,op1);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)expr._M_dataplus._M_p != &expr.field_2) {
    operator_delete(expr._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)bitop._M_dataplus._M_p != &bitop.field_2) {
    operator_delete(bitop._M_dataplus._M_p);
  }
  expected_type.super_IVariant._vptr_IVariant = (_func_int **)&PTR__SPIRType_003a2fa8;
  ::std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::~_Hashtable(&expected_type.member_name_cache._M_h);
  expected_type.member_type_index_redirection.super_VectorView<unsigned_int>.buffer_size = 0;
  if ((AlignedBuffer<unsigned_int,_8UL> *)
      expected_type.member_type_index_redirection.super_VectorView<unsigned_int>.ptr !=
      &expected_type.member_type_index_redirection.stack_storage) {
    free(expected_type.member_type_index_redirection.super_VectorView<unsigned_int>.ptr);
  }
  expected_type.member_types.super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.
  buffer_size = 0;
  if ((AlignedBuffer<spirv_cross::TypedID<(spirv_cross::Types)1>,_8UL> *)
      expected_type.member_types.super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.ptr
      != &expected_type.member_types.stack_storage) {
    free(expected_type.member_types.super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.
         ptr);
  }
  expected_type.array_size_literal.super_VectorView<bool>.buffer_size = 0;
  if ((AlignedBuffer<bool,_8UL> *)expected_type.array_size_literal.super_VectorView<bool>.ptr !=
      &expected_type.array_size_literal.stack_storage) {
    free(expected_type.array_size_literal.super_VectorView<bool>.ptr);
  }
  expected_type.array.super_VectorView<unsigned_int>.buffer_size = 0;
  if ((AlignedBuffer<unsigned_int,_8UL> *)expected_type.array.super_VectorView<unsigned_int>.ptr !=
      &expected_type.array.stack_storage) {
    free(expected_type.array.super_VectorView<unsigned_int>.ptr);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)cast_op1._M_dataplus._M_p != &cast_op1.field_2) {
    operator_delete(cast_op1._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)cast_op0._M_dataplus._M_p != &cast_op0.field_2) {
    operator_delete(cast_op0._M_dataplus._M_p);
  }
  return;
}

Assistant:

void CompilerGLSL::emit_binary_op_cast(uint32_t result_type, uint32_t result_id, uint32_t op0, uint32_t op1,
                                       const char *op, SPIRType::BaseType input_type,
                                       bool skip_cast_if_equal_type,
                                       bool implicit_integer_promotion)
{
	string cast_op0, cast_op1;
	auto expected_type = binary_op_bitcast_helper(cast_op0, cast_op1, input_type, op0, op1, skip_cast_if_equal_type);
	auto &out_type = get<SPIRType>(result_type);

	// We might have casted away from the result type, so bitcast again.
	// For example, arithmetic right shift with uint inputs.
	// Special case boolean outputs since relational opcodes output booleans instead of int/uint.
	auto bitop = join(cast_op0, " ", op, " ", cast_op1);
	string expr;

	if (implicit_integer_promotion)
	{
		// Simple value cast.
		expr = join(type_to_glsl(out_type), '(', bitop, ')');
	}
	else if (out_type.basetype != input_type && out_type.basetype != SPIRType::Boolean)
	{
		expected_type.basetype = input_type;
		expr = join(bitcast_glsl_op(out_type, expected_type), '(', bitop, ')');
	}
	else
	{
		expr = std::move(bitop);
	}

	emit_op(result_type, result_id, expr, should_forward(op0) && should_forward(op1));
	inherit_expression_dependencies(result_id, op0);
	inherit_expression_dependencies(result_id, op1);
}